

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

void __thiscall RenX_RelayPlugin::RenX_OnServerFullyConnected(RenX_RelayPlugin *this,Server *server)

{
  mapped_type *this_00;
  bool bVar1;
  reference puVar2;
  reference pvVar3;
  TCPSocket *this_01;
  pointer pTVar4;
  char *pcVar5;
  ulong uVar6;
  unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_> local_70;
  reference local_68;
  upstream_server_info *server_info;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  upstream_settings *settings;
  iterator __end2;
  iterator __begin2;
  vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
  *__range2;
  mapped_type *local_20;
  mapped_type *server_infos;
  Server *server_local;
  RenX_RelayPlugin *this_local;
  
  __range2 = (vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
              *)server;
  server_infos = (mapped_type *)server;
  server_local = (Server *)this;
  local_20 = std::
             unordered_map<RenX::Server_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>,_std::hash<RenX::Server_*>,_std::equal_to<RenX::Server_*>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>_>
             ::operator[](&this->m_server_info_map,(key_type *)&__range2);
  bVar1 = std::
          vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
          ::empty(local_20);
  if (bVar1) {
    __end2 = std::
             vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
             ::begin(&this->m_configured_upstreams);
    settings = (upstream_settings *)
               std::
               vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
               ::end(&this->m_configured_upstreams);
    while (bVar1 = __gnu_cxx::
                   operator==<RenX_RelayPlugin::upstream_settings_*,_std::vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>_>
                             (&__end2,(__normal_iterator<RenX_RelayPlugin::upstream_settings_*,_std::vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>_>
                                       *)&settings), ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar2 = __gnu_cxx::
               __normal_iterator<RenX_RelayPlugin::upstream_settings_*,_std::vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>_>
               ::operator*(&__end2);
      pvVar3 = std::
               vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
               ::emplace_back<>(local_20);
      pvVar3->m_settings = puVar2;
      __gnu_cxx::
      __normal_iterator<RenX_RelayPlugin::upstream_settings_*,_std::vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>_>
      ::operator++(&__end2);
    }
  }
  this_00 = local_20;
  __end1 = std::
           vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
           ::begin(local_20);
  server_info = (upstream_server_info *)
                std::
                vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
                ::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
                           (&__end1,(__normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
                                     *)&server_info), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_68 = __gnu_cxx::
               __normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
               ::operator*(&__end1);
    if ((local_68->m_connected & 1U) == 0) {
      this_01 = (TCPSocket *)operator_new(0x10);
      Jupiter::TCPSocket::TCPSocket(this_01);
      std::unique_ptr<Jupiter::TCPSocket,std::default_delete<Jupiter::TCPSocket>>::
      unique_ptr<std::default_delete<Jupiter::TCPSocket>,void>
                ((unique_ptr<Jupiter::TCPSocket,std::default_delete<Jupiter::TCPSocket>> *)&local_70
                 ,this_01);
      std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::operator=
                (&local_68->m_socket,&local_70);
      std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::~unique_ptr
                (&local_70);
      pTVar4 = std::unique_ptr<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>::
               operator->(&local_68->m_socket);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&local_68->m_settings->m_upstream_hostname);
      uVar6 = (**(code **)(*(long *)pTVar4 + 8))
                        (pTVar4,pcVar5,local_68->m_settings->m_upstream_port,0,0);
      if ((uVar6 & 1) != 0) {
        upstream_connected(this,(Server *)server_infos,local_68);
      }
    }
    __gnu_cxx::
    __normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnServerFullyConnected(RenX::Server &server) {
	auto& server_infos = m_server_info_map[&server];
	if (server_infos.empty()) {
		for (const auto& settings : m_configured_upstreams) {
			server_infos.emplace_back().m_settings = &settings;
		}
	}

	for (auto& server_info : server_infos) {
		if (!server_info.m_connected) {
			server_info.m_socket = std::unique_ptr<Jupiter::TCPSocket>(new Jupiter::TCPSocket());
			if (server_info.m_socket->connect(server_info.m_settings->m_upstream_hostname.c_str(), server_info.m_settings->m_upstream_port)) {
				upstream_connected(server, server_info);
			}
		}
	}
}